

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

parse_return __thiscall
msgpack::v2::detail::
context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>::
start_aggregate<msgpack::v1::detail::fix_tag,msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>::map_sv,msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>::map_ev>
          (context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
           *this,map_sv *sv,map_ev *ev,char *load_pos,size_t *off)

{
  bool bVar1;
  parse_return pVar2;
  char *in_RCX;
  map_sv *in_RSI;
  context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_> *in_RDI;
  long *in_R8;
  parse_return ret_1;
  parse_return ret;
  type size;
  uint32_t in_stack_ffffffffffffff9c;
  map_sv *in_stack_ffffffffffffffa0;
  parse_helper<msgpack::v2::detail::create_object_visitor> *visitor_holder;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  
  v1::detail::load<msgpack::v1::detail::fix_tag>((uint32_t *)&stack0xffffffffffffffcc,in_RCX);
  in_RDI->m_current = in_RDI->m_current + 1;
  if (in_stack_ffffffffffffffcc == 0) {
    bVar1 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::map_sv::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if (!bVar1) {
      *in_R8 = (long)in_RDI->m_current - (long)in_RDI->m_start;
      return PARSE_STOP_VISITOR;
    }
    bVar1 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::map_ev::operator()((map_ev *)0x1f1662);
    if (!bVar1) {
      *in_R8 = (long)in_RDI->m_current - (long)in_RDI->m_start;
      return PARSE_STOP_VISITOR;
    }
    visitor_holder = (parse_helper<msgpack::v2::detail::create_object_visitor> *)&in_RDI->m_stack;
    context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::holder
              (in_RDI);
    pVar2 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::unpack_stack::consume((unpack_stack *)in_RDI,visitor_holder);
    if (pVar2 != PARSE_CONTINUE) {
      *in_R8 = (long)in_RDI->m_current - (long)in_RDI->m_start;
      return pVar2;
    }
  }
  else {
    bVar1 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::map_sv::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if (!bVar1) {
      *in_R8 = (long)in_RDI->m_current - (long)in_RDI->m_start;
      return PARSE_STOP_VISITOR;
    }
    context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::holder
              (in_RDI);
    context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::map_sv
    ::type(in_RSI);
    pVar2 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::unpack_stack::push
                      ((unpack_stack *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                       ,(parse_helper<msgpack::v2::detail::create_object_visitor> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (msgpack_container_type)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    if (pVar2 != PARSE_CONTINUE) {
      *in_R8 = (long)in_RDI->m_current - (long)in_RDI->m_start;
      return pVar2;
    }
  }
  in_RDI->m_cs = 0;
  return PARSE_CONTINUE;
}

Assistant:

parse_return start_aggregate(
        StartVisitor const& sv,
        EndVisitor const& ev,
        const char* load_pos,
        std::size_t& off) {
        typename value<T>::type size;
        load<T>(size, load_pos);
        ++m_current;
        if (size == 0) {
            if (!sv(size)) {
                off = static_cast<std::size_t>(m_current - m_start);
                return PARSE_STOP_VISITOR;
            }
            if (!ev()) {
                off = static_cast<std::size_t>(m_current - m_start);
                return PARSE_STOP_VISITOR;
            }
            parse_return ret = m_stack.consume(holder());
            if (ret != PARSE_CONTINUE) {
                off = static_cast<std::size_t>(m_current - m_start);
                return ret;
            }
        }
        else {
            if (!sv(size)) {
                off = static_cast<std::size_t>(m_current - m_start);
                return PARSE_STOP_VISITOR;
            }
            parse_return ret = m_stack.push(holder(), sv.type(), static_cast<uint32_t>(size));
            if (ret != PARSE_CONTINUE) {
                off = static_cast<std::size_t>(m_current - m_start);
                return ret;
            }
        }
        m_cs = MSGPACK_CS_HEADER;
        return PARSE_CONTINUE;
    }